

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

aiNodeAnim * __thiscall
Assimp::FBX::FBXConverter::GenerateSimpleNodeAnim
          (FBXConverter *this,string *name,Model *target,const_iterator *chain,
          const_iterator iter_end,LayerMap *layer_map,int64_t start,int64_t stop,double *max_time,
          double *min_time,bool reverse_order)

{
  pointer *pptVar1;
  PropertyTable *this_00;
  _Base_ptr p_Var2;
  undefined1 auVar3 [16];
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> uVar4;
  pointer plVar5;
  RotOrder RVar6;
  __uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true> na_00;
  Property *pPVar7;
  long lVar8;
  KeyFrameListList *pKVar9;
  aiVectorKey *paVar10;
  aiVectorKey *out_translation;
  undefined8 *puVar11;
  _Head_base<0UL,_aiNodeAnim_*,_false> _Var12;
  char *pcVar13;
  float *pfVar14;
  aiQuatKey *paVar15;
  undefined4 *puVar16;
  ulong uVar17;
  pointer_____offset_0x10___ *this_01;
  FBXConverter *pFVar18;
  _Base_ptr p_Var19;
  ulong uVar20;
  ulong uVar21;
  undefined4 uVar22;
  aiQuaternion aVar23;
  KeyFrameListList joined;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> na;
  KeyFrameListList local_f8;
  undefined1 local_d8 [8];
  _Base_ptr p_Stack_d0;
  _Base_ptr local_c8;
  KeyTimeList local_b8;
  FBXConverter *local_98;
  FBXConverter *local_90;
  undefined1 local_88 [8];
  _Base_ptr p_Stack_80;
  _Base_ptr local_78;
  aiQuatKey *local_68;
  pointer local_60;
  float local_58;
  _Base_ptr local_50;
  char local_48 [8];
  _Base_ptr local_40;
  float local_38;
  
  this_01 = (pointer_____offset_0x10___ *)&joined;
  _Var12._M_head_impl = (aiNodeAnim *)chain;
  local_98 = this;
  local_90 = (FBXConverter *)target;
  na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       (__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>)operator_new(0x438);
  *(undefined4 *)
   na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
   super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
   super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl = 0;
  *(char *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 4) = '\0';
  memset((char *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                        _M_t.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                        super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 5),0x1b,0x3ff);
  *(aiQuatKey **)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x418) = (aiQuatKey *)0x0;
  *(uint *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x420) = 0;
  *(undefined8 *)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x404) = 0;
  *(undefined8 *)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x40c) = 0;
  *(aiVectorKey **)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x428) = (aiVectorKey *)0x0;
  *(undefined8 *)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x430) = 0;
  uVar17 = name->_M_string_length;
  na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
       na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
       super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
       super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl;
  if (uVar17 < 0x400) {
    *(int *)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
            super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
            super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl = (int)uVar17;
    memcpy((char *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 4),
           (name->_M_dataplus)._M_p,uVar17);
    ((char *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                    super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                    super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 4))[uVar17] = '\0';
  }
  this_00 = (PropertyTable *)
            (local_90->materials_converted)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (this_00 != (PropertyTable *)0x0) {
    if (reverse_order) {
      pptVar1 = &joined.
                 super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pptVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&joined,"Lcl Scaling","");
      local_f8.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f8000003f800000;
      local_d8._0_4_ = 0x3f800000;
      pPVar7 = PropertyTable::Get(this_00,(string *)&joined);
      if (pPVar7 == (Property *)0x0) {
        pKVar9 = &local_f8;
        local_38 = 1.0;
      }
      else {
        lVar8 = __dynamic_cast(pPVar7,&Property::typeinfo,
                               &TypedProperty<aiVector3t<float>>::typeinfo,0);
        pKVar9 = &local_f8;
        if (lVar8 != 0) {
          pKVar9 = (KeyFrameListList *)(lVar8 + 8);
        }
        pfVar14 = (float *)local_d8;
        if (lVar8 != 0) {
          pfVar14 = (float *)(lVar8 + 0x10);
        }
        local_38 = *pfVar14;
      }
      local_40 = (_Base_ptr)
                 (pKVar9->
                 super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      if (joined.
          super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)pptVar1) {
        operator_delete(joined.
                        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((joined.
                                         super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                       ).
                                       super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                       .super__Tuple_impl<2UL,_unsigned_int>.
                                       super__Head_base<2UL,_unsigned_int,_false>._M_head_impl + 1))
        ;
      }
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pptVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&joined,"Lcl Translation","");
      local_f8.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8 = (undefined1  [8])((ulong)local_d8 & 0xffffffff00000000);
      pPVar7 = PropertyTable::Get(this_00,(string *)&joined);
      if (pPVar7 == (Property *)0x0) {
        pKVar9 = &local_f8;
        local_48[0] = '\0';
        local_48[1] = '\0';
        local_48[2] = '\0';
        local_48[3] = '\0';
      }
      else {
        lVar8 = __dynamic_cast(pPVar7,&Property::typeinfo,
                               &TypedProperty<aiVector3t<float>>::typeinfo,0);
        pKVar9 = &local_f8;
        if (lVar8 != 0) {
          pKVar9 = (KeyFrameListList *)(lVar8 + 8);
        }
        pcVar13 = local_d8;
        if (lVar8 != 0) {
          pcVar13 = (char *)(lVar8 + 0x10);
        }
        local_48._0_4_ = *(undefined4 *)pcVar13;
      }
      local_50 = (_Base_ptr)
                 (pKVar9->
                 super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      if (joined.
          super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)pptVar1) {
        operator_delete(joined.
                        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((joined.
                                         super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                       ).
                                       super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                       .super__Tuple_impl<2UL,_unsigned_int>.
                                       super__Head_base<2UL,_unsigned_int,_false>._M_head_impl + 1))
        ;
      }
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pptVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&joined,"Lcl Rotation","");
      local_f8.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8 = (undefined1  [8])((ulong)local_d8 & 0xffffffff00000000);
      pPVar7 = PropertyTable::Get(this_00,(string *)&joined);
      if (pPVar7 == (Property *)0x0) {
        pKVar9 = &local_f8;
        local_58 = 0.0;
      }
      else {
        this_01 = &Property::typeinfo;
        lVar8 = __dynamic_cast(pPVar7,&Property::typeinfo,
                               &TypedProperty<aiVector3t<float>>::typeinfo,0);
        pKVar9 = &local_f8;
        if (lVar8 != 0) {
          pKVar9 = (KeyFrameListList *)(lVar8 + 8);
        }
        pfVar14 = (float *)local_d8;
        if (lVar8 != 0) {
          pfVar14 = (float *)(lVar8 + 0x10);
        }
        local_58 = *pfVar14;
      }
      local_60 = (pKVar9->
                 super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      if (joined.
          super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)pptVar1) {
        this_01 = (pointer_____offset_0x10___ *)
                  ((long)&((joined.
                            super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                          super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                          ).
                          super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                          .super__Tuple_impl<2UL,_unsigned_int>.
                          super__Head_base<2UL,_unsigned_int,_false>._M_head_impl + 1);
        operator_delete(joined.
                        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,(ulong)this_01);
      }
      local_f8.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_f8.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8 = (_Base_ptr)0x0;
      local_d8 = (undefined1  [8])0x0;
      p_Stack_d0 = (_Base_ptr)0x0;
      local_78 = (_Base_ptr)0x0;
      local_88 = (undefined1  [8])0x0;
      p_Stack_80 = (_Base_ptr)0x0;
      if (chain[0xc]._M_node != iter_end._M_node) {
        GetKeyframeList((KeyFrameListList *)&local_b8,(FBXConverter *)this_01,
                        (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                         *)(chain[0xc]._M_node + 2),start,stop);
        joined.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_f8.
             super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        joined.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_f8.
             super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        joined.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_f8.
             super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_f8.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
        local_f8.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start;
        local_f8.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish;
        local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::
        vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ::~vector(&joined);
        std::
        vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ::~vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                   *)&local_b8);
      }
      if (chain[3]._M_node != iter_end._M_node) {
        GetKeyframeList((KeyFrameListList *)&local_b8,(FBXConverter *)this_01,
                        (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                         *)(chain[3]._M_node + 2),start,stop);
        joined.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_c8;
        joined.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Stack_d0;
        joined.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_d8;
        local_c8 = (_Base_ptr)
                   local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        local_d8 = (undefined1  [8])
                   local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        p_Stack_d0 = (_Base_ptr)
                     local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::
        vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ::~vector(&joined);
        std::
        vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ::~vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                   *)&local_b8);
      }
      if (chain[7]._M_node != iter_end._M_node) {
        GetKeyframeList((KeyFrameListList *)&local_b8,(FBXConverter *)this_01,
                        (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                         *)(chain[7]._M_node + 2),start,stop);
        joined.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_78;
        joined.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Stack_80;
        joined.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88;
        local_78 = (_Base_ptr)
                   local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        local_88 = (undefined1  [8])
                   local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        p_Stack_80 = (_Base_ptr)
                     local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::
        vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ::~vector(&joined);
        std::
        vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ::~vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                   *)&local_b8);
      }
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
      ::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>*,std::vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>>>
                ((vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
                  *)&joined,0,
                 local_f8.
                 super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_f8.
                 super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
      ::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>*,std::vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>>>
                ((vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
                  *)&joined,
                 joined.
                 super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,local_d8,p_Stack_d0);
      pFVar18 = (FBXConverter *)
                joined.
                super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
      ::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>*,std::vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>>>
                ((vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
                  *)&joined,
                 joined.
                 super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,local_88,p_Stack_80);
      GetKeyTimeList(&local_b8,pFVar18,&joined);
      plVar5 = local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      p_Var19 = (_Base_ptr)
                local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar21 = (long)local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uVar20 = (long)uVar21 >> 3;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar20;
      uVar17 = 0xffffffffffffffff;
      if (SUB168(auVar3 * ZEXT816(0x18),8) == 0) {
        uVar17 = SUB168(auVar3 * ZEXT816(0x18),0);
      }
      local_68 = (aiQuatKey *)operator_new__(uVar17);
      if ((_Base_ptr)plVar5 != p_Var19) {
        paVar15 = local_68;
        do {
          paVar15->mTime = 0.0;
          (paVar15->mValue).w = 1.0;
          (paVar15->mValue).x = 0.0;
          (paVar15->mValue).y = 0.0;
          (paVar15->mValue).z = 0.0;
          paVar15 = paVar15 + 1;
        } while (paVar15 != local_68 + uVar20);
      }
      paVar10 = (aiVectorKey *)operator_new__(uVar17);
      if ((_Base_ptr)plVar5 != p_Var19) {
        lVar8 = 0;
        do {
          puVar11 = (undefined8 *)((long)&paVar10->mTime + lVar8);
          *puVar11 = 0;
          puVar11[1] = 0;
          *(undefined4 *)((long)&(paVar10->mValue).z + lVar8) = 0;
          lVar8 = lVar8 + 0x18;
        } while (uVar20 * 0x18 != lVar8);
      }
      out_translation = (aiVectorKey *)operator_new__(uVar17);
      if ((_Base_ptr)plVar5 != p_Var19) {
        lVar8 = 0;
        do {
          puVar11 = (undefined8 *)((long)&out_translation->mTime + lVar8);
          *puVar11 = 0;
          puVar11[1] = 0;
          *(undefined4 *)((long)&(out_translation->mValue).z + lVar8) = 0;
          lVar8 = lVar8 + 0x18;
        } while (uVar20 * 0x18 != lVar8);
        RVar6 = Model::RotationOrder((Model *)local_90);
        ConvertTransformOrder_TRStoSRT
                  (local_98,local_68,paVar10,out_translation,&local_f8,(KeyFrameListList *)local_d8,
                   (KeyFrameListList *)local_88,&local_b8,max_time,min_time,RVar6,
                   (aiVector3D *)&local_40,(aiVector3D *)&local_50,(aiVector3D *)&local_60);
        uVar21 = (long)local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start;
        p_Var19 = (_Base_ptr)
                  local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      uVar22 = (undefined4)(uVar21 >> 3);
      *(undefined4 *)
       ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
              super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
              super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x420) = uVar22;
      *(undefined4 *)
       ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
              super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
              super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x410) = uVar22;
      *(undefined4 *)
       ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
              super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
              super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x404) = uVar22;
      *(aiVectorKey **)
       ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
              super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
              super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x428) = paVar10;
      *(aiQuatKey **)
       ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
              super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
              super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x418) = local_68;
      *(aiVectorKey **)
       ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
              super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
              super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x408) = out_translation;
      if (p_Var19 != (_Base_ptr)0x0) {
        operator_delete(p_Var19,(long)local_b8.super__Vector_base<long,_std::allocator<long>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)p_Var19);
      }
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::~vector(&joined);
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::~vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 *)local_88);
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::~vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 *)local_d8);
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::~vector(&local_f8);
    }
    else {
      if (chain[0xc]._M_node == iter_end._M_node) {
        paVar10 = (aiVectorKey *)operator_new__(0x18);
        _Var12._M_head_impl = (aiNodeAnim *)0x0;
        (paVar10->mValue).x = 0.0;
        (paVar10->mValue).y = 0.0;
        (paVar10->mValue).z = 0.0;
        *(aiVectorKey **)
         ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x428) = paVar10;
        *(uint *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                        _M_t.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                        super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x420) = 1;
        paVar10->mTime = 0.0;
        pptVar1 = &joined.
                   super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        joined.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pptVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&joined,"Lcl Scaling","");
        local_f8.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f8000003f800000;
        local_d8._0_4_ = 0x3f800000;
        pPVar7 = PropertyTable::Get(this_00,(string *)&joined);
        if (pPVar7 == (Property *)0x0) {
          pKVar9 = &local_f8;
          uVar22 = 0x3f800000;
        }
        else {
          lVar8 = __dynamic_cast(pPVar7,&Property::typeinfo,
                                 &TypedProperty<aiVector3t<float>>::typeinfo,0);
          pKVar9 = &local_f8;
          if (lVar8 != 0) {
            pKVar9 = (KeyFrameListList *)(lVar8 + 8);
          }
          _Var12._M_head_impl = (aiNodeAnim *)local_d8;
          if (lVar8 != 0) {
            _Var12._M_head_impl = (aiNodeAnim *)(lVar8 + 0x10);
          }
          uVar22 = *(undefined4 *)&((_Var12._M_head_impl)->mNodeName).length;
        }
        lVar8 = *(long *)((long)na._M_t.
                                super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                                _M_t.
                                super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>
                                .super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x428);
        *(pointer *)(lVar8 + 8) =
             (pKVar9->
             super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        *(undefined4 *)(lVar8 + 0x10) = uVar22;
        if (joined.
            super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)pptVar1) {
          operator_delete(joined.
                          super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((joined.
                                           super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                         ).
                                         super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                         .super__Tuple_impl<2UL,_unsigned_int>.
                                         super__Head_base<2UL,_unsigned_int,_false>._M_head_impl + 1
                                 ));
        }
      }
      else {
        ConvertScaleKeys(local_98,(aiNodeAnim *)
                                  na_00.
                                  super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>
                                  .super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl,
                         (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                          *)(chain[0xc]._M_node + 2),(LayerMap *)_Var12._M_head_impl,start,stop,
                         max_time,min_time);
      }
      uVar4._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
      super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
      super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
           na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
           super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
           super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl;
      p_Var2 = chain[7]._M_node;
      if (p_Var2 == iter_end._M_node) {
        puVar11 = (undefined8 *)operator_new__(0x18);
        puVar11[1] = 0x3f800000;
        puVar11[2] = 0;
        *(undefined8 **)
         ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x418) = puVar11;
        *(undefined4 *)
         ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x410) = 1;
        *puVar11 = 0;
        pptVar1 = &joined.
                   super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        _Var12._M_head_impl = (aiNodeAnim *)na;
        joined.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pptVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&joined,"Lcl Rotation","");
        local_d8 = (undefined1  [8])0x0;
        local_88 = (undefined1  [8])((ulong)(uint)local_88._4_4_ << 0x20);
        pPVar7 = PropertyTable::Get(this_00,(string *)&joined);
        if (pPVar7 == (Property *)0x0) {
          puVar11 = (undefined8 *)local_d8;
          uVar22 = 0;
        }
        else {
          lVar8 = __dynamic_cast(pPVar7,&Property::typeinfo,
                                 &TypedProperty<aiVector3t<float>>::typeinfo,0);
          puVar11 = (undefined8 *)local_d8;
          if (lVar8 != 0) {
            puVar11 = (undefined8 *)(lVar8 + 8);
          }
          _Var12._M_head_impl = (aiNodeAnim *)local_88;
          if (lVar8 != 0) {
            _Var12._M_head_impl = (aiNodeAnim *)(lVar8 + 0x10);
          }
          uVar22 = *(undefined4 *)&((_Var12._M_head_impl)->mNodeName).length;
        }
        local_f8.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar11;
        local_f8.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(local_f8.
                               super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,uVar22);
        pFVar18 = local_90;
        RVar6 = Model::RotationOrder((Model *)local_90);
        aVar23 = EulerToQuaternion(pFVar18,(aiVector3D *)&local_f8,RVar6);
        *(aiQuaternion *)
         (*(long *)((long)na._M_t.
                          super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x418) + 8) =
             aVar23;
        if (joined.
            super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)pptVar1) {
          operator_delete(joined.
                          super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((joined.
                                           super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                         ).
                                         super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                         .super__Tuple_impl<2UL,_unsigned_int>.
                                         super__Head_base<2UL,_unsigned_int,_false>._M_head_impl + 1
                                 ));
        }
      }
      else {
        RVar6 = Model::RotationOrder((Model *)local_90);
        ConvertRotationKeys(local_98,(aiNodeAnim *)
                                     uVar4._M_t.
                                     super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>
                                     .super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl,
                            (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                             *)(p_Var2 + 2),(LayerMap *)_Var12._M_head_impl,start,stop,max_time,
                            min_time,RVar6);
      }
      if (chain[3]._M_node == iter_end._M_node) {
        puVar11 = (undefined8 *)operator_new__(0x18);
        puVar11[1] = 0;
        *(undefined4 *)(puVar11 + 2) = 0;
        *(undefined8 **)
         ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x408) = puVar11;
        *(undefined4 *)
         ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x404) = 1;
        *puVar11 = 0;
        pptVar1 = &joined.
                   super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        joined.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pptVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&joined,"Lcl Translation","");
        local_f8.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d8 = (undefined1  [8])((ulong)local_d8 & 0xffffffff00000000);
        pPVar7 = PropertyTable::Get(this_00,(string *)&joined);
        if (pPVar7 == (Property *)0x0) {
          pKVar9 = &local_f8;
          uVar22 = 0;
        }
        else {
          lVar8 = __dynamic_cast(pPVar7,&Property::typeinfo,
                                 &TypedProperty<aiVector3t<float>>::typeinfo,0);
          pKVar9 = &local_f8;
          if (lVar8 != 0) {
            pKVar9 = (KeyFrameListList *)(lVar8 + 8);
          }
          puVar16 = (undefined4 *)local_d8;
          if (lVar8 != 0) {
            puVar16 = (undefined4 *)(lVar8 + 0x10);
          }
          uVar22 = *puVar16;
        }
        lVar8 = *(long *)((long)na._M_t.
                                super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                                _M_t.
                                super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>
                                .super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x408);
        *(pointer *)(lVar8 + 8) =
             (pKVar9->
             super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        *(undefined4 *)(lVar8 + 0x10) = uVar22;
        if (joined.
            super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)pptVar1) {
          operator_delete(joined.
                          super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((joined.
                                           super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                         ).
                                         super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                         .super__Tuple_impl<2UL,_unsigned_int>.
                                         super__Head_base<2UL,_unsigned_int,_false>._M_head_impl + 1
                                 ));
        }
      }
      else {
        ConvertTranslationKeys
                  (local_98,(aiNodeAnim *)
                            na._M_t.
                            super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t
                            .super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                            super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl,
                   (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                    *)(chain[3]._M_node + 2),(LayerMap *)_Var12._M_head_impl,start,stop,max_time,
                   min_time);
      }
    }
    uVar4._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
    super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
    super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
         na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
         super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
         super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl;
    na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
    super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
    super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
         (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
         (__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>)0x0;
    std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::~unique_ptr(&na);
    return (aiNodeAnim *)
           (__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>)
           uVar4._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
           super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
           super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl;
  }
  __assert_fail("props.get()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXDocument.h"
                ,0x1b4,"const PropertyTable &Assimp::FBX::Model::Props() const");
}

Assistant:

aiNodeAnim* FBXConverter::GenerateSimpleNodeAnim(const std::string& name,
            const Model& target,
            NodeMap::const_iterator chain[TransformationComp_MAXIMUM],
            NodeMap::const_iterator iter_end,
            const LayerMap& layer_map,
            int64_t start, int64_t stop,
            double& max_time,
            double& min_time,
            bool reverse_order)

        {
            std::unique_ptr<aiNodeAnim> na(new aiNodeAnim());
            na->mNodeName.Set(name);

            const PropertyTable& props = target.Props();

            // need to convert from TRS order to SRT?
            if (reverse_order) {

                aiVector3D def_scale = PropertyGet(props, "Lcl Scaling", aiVector3D(1.f, 1.f, 1.f));
                aiVector3D def_translate = PropertyGet(props, "Lcl Translation", aiVector3D(0.f, 0.f, 0.f));
                aiVector3D def_rot = PropertyGet(props, "Lcl Rotation", aiVector3D(0.f, 0.f, 0.f));

                KeyFrameListList scaling;
                KeyFrameListList translation;
                KeyFrameListList rotation;

                if (chain[TransformationComp_Scaling] != iter_end) {
                    scaling = GetKeyframeList((*chain[TransformationComp_Scaling]).second, start, stop);
                }

                if (chain[TransformationComp_Translation] != iter_end) {
                    translation = GetKeyframeList((*chain[TransformationComp_Translation]).second, start, stop);
                }

                if (chain[TransformationComp_Rotation] != iter_end) {
                    rotation = GetKeyframeList((*chain[TransformationComp_Rotation]).second, start, stop);
                }

                KeyFrameListList joined;
                joined.insert(joined.end(), scaling.begin(), scaling.end());
                joined.insert(joined.end(), translation.begin(), translation.end());
                joined.insert(joined.end(), rotation.begin(), rotation.end());

                const KeyTimeList& times = GetKeyTimeList(joined);

                aiQuatKey* out_quat = new aiQuatKey[times.size()];
                aiVectorKey* out_scale = new aiVectorKey[times.size()];
                aiVectorKey* out_translation = new aiVectorKey[times.size()];

                if (times.size())
                {
                    ConvertTransformOrder_TRStoSRT(out_quat, out_scale, out_translation,
                        scaling,
                        translation,
                        rotation,
                        times,
                        max_time,
                        min_time,
                        target.RotationOrder(),
                        def_scale,
                        def_translate,
                        def_rot);
                }

                // XXX remove duplicates / redundant keys which this operation did
                // likely produce if not all three channels were equally dense.

                na->mNumScalingKeys = static_cast<unsigned int>(times.size());
                na->mNumRotationKeys = na->mNumScalingKeys;
                na->mNumPositionKeys = na->mNumScalingKeys;

                na->mScalingKeys = out_scale;
                na->mRotationKeys = out_quat;
                na->mPositionKeys = out_translation;
            }
            else {

                // if a particular transformation is not given, grab it from
                // the corresponding node to meet the semantics of aiNodeAnim,
                // which requires all of rotation, scaling and translation
                // to be set.
                if (chain[TransformationComp_Scaling] != iter_end) {
                    ConvertScaleKeys(na.get(), (*chain[TransformationComp_Scaling]).second,
                        layer_map,
                        start, stop,
                        max_time,
                        min_time);
                }
                else {
                    na->mScalingKeys = new aiVectorKey[1];
                    na->mNumScalingKeys = 1;

                    na->mScalingKeys[0].mTime = 0.;
                    na->mScalingKeys[0].mValue = PropertyGet(props, "Lcl Scaling",
                        aiVector3D(1.f, 1.f, 1.f));
                }

                if (chain[TransformationComp_Rotation] != iter_end) {
                    ConvertRotationKeys(na.get(), (*chain[TransformationComp_Rotation]).second,
                        layer_map,
                        start, stop,
                        max_time,
                        min_time,
                        target.RotationOrder());
                }
                else {
                    na->mRotationKeys = new aiQuatKey[1];
                    na->mNumRotationKeys = 1;

                    na->mRotationKeys[0].mTime = 0.;
                    na->mRotationKeys[0].mValue = EulerToQuaternion(
                        PropertyGet(props, "Lcl Rotation", aiVector3D(0.f, 0.f, 0.f)),
                        target.RotationOrder());
                }

                if (chain[TransformationComp_Translation] != iter_end) {
                    ConvertTranslationKeys(na.get(), (*chain[TransformationComp_Translation]).second,
                        layer_map,
                        start, stop,
                        max_time,
                        min_time);
                }
                else {
                    na->mPositionKeys = new aiVectorKey[1];
                    na->mNumPositionKeys = 1;

                    na->mPositionKeys[0].mTime = 0.;
                    na->mPositionKeys[0].mValue = PropertyGet(props, "Lcl Translation",
                        aiVector3D(0.f, 0.f, 0.f));
                }

            }
            return na.release();
        }